

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O2

bool tinyusdz::anon_unknown_160::CompositeReferencesRec
               (uint32_t depth,AssetResolutionResolver *resolver,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *asset_search_paths,Layer *in_layer,PrimSpec *primspec,string *warn,string *err,
               ReferencesCompositionOptions *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>_>
  *this;
  ListEditQual LVar2;
  Layer *pLVar3;
  Layer *pLVar4;
  bool bVar5;
  ostream *poVar6;
  value_type *pvVar7;
  value_type *pvVar8;
  string *args;
  PrimSpec *extraout_RDX;
  PrimSpec *extraout_RDX_00;
  PrimSpec *extraout_RDX_01;
  PrimSpec *extraout_RDX_02;
  PrimSpec *pPVar9;
  PrimSpec *child;
  Layer *pLVar10;
  Path *path;
  int iVar11;
  char *pcVar12;
  PrimSpec *err_00;
  ReferencesCompositionOptions *in_stack_ffffffffffffe770;
  allocator local_1871;
  PrimSpec *src_ps;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1868;
  Layer *local_1860;
  AssetPath *local_1858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1850;
  pointer local_1848;
  optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>_>
  *local_1840;
  string local_1838;
  string local_1818;
  string local_17f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  search_paths;
  string cwp;
  ostringstream ss_e_1;
  ostringstream ss_e;
  
  if (*(uint *)&(err->_M_dataplus)._M_p < depth) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar6 = ::std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                              );
    poVar6 = ::std::operator<<(poVar6,":");
    poVar6 = ::std::operator<<(poVar6,"CompositeReferencesRec");
    poVar6 = ::std::operator<<(poVar6,"():");
    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x272);
    ::std::operator<<(poVar6," ");
    poVar6 = ::std::operator<<((ostream *)&ss_e,"Too deep.");
    ::std::operator<<(poVar6,"\n");
    if (warn != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)warn);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  }
  else {
    pLVar10 = (Layer *)(in_layer->_prim_specs)._M_h._M_rehash_policy._M_next_resize;
    pLVar3 = (Layer *)(in_layer->_prim_specs)._M_h._M_single_bucket;
    err_00 = primspec;
    local_1860 = in_layer;
    do {
      pLVar4 = local_1860;
      if (pLVar10 == pLVar3) {
        ::std::__cxx11::string::string
                  ((string *)&cwp,
                   (string *)
                   ((long)&(local_1860->_metas).timeCodesPerSecond._metas.comment.contained + 0x18))
        ;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&search_paths,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&(pLVar4->_metas).timeCodesPerSecond._metas.customData.contained);
        this = (optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>_>
                *)((long)&(pLVar4->_metas).metersPerUnit._metas.comment.contained.data + 0x18);
        local_1840 = this;
        if (*(char *)((long)&(pLVar4->_metas).metersPerUnit._metas.comment.contained + 0x18) !=
            '\x01') goto switchD_0017014d_default;
        pvVar7 = nonstd::optional_lite::
                 optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>_>
                 ::value(this);
        pvVar8 = nonstd::optional_lite::
                 optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>_>
                 ::value(this);
        LVar2 = pvVar7->first;
        if (6 < (ulong)LVar2) goto switchD_0017014d_default;
        args = (string *)
               ((long)&switchD_0017014d::switchdataD_0030dabc +
               (long)(int)(&switchD_0017014d::switchdataD_0030dabc)[LVar2]);
        switch(LVar2) {
        default:
          local_1848 = (pvVar8->second).
                       super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          local_1850 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &err->_M_string_length;
          local_1868 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &(local_1860->_name)._M_string_length;
          path = &((pvVar8->second).
                   super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>.
                   _M_impl.super__Vector_impl_data._M_start)->prim_path;
          goto LAB_0017017f;
        case Append:
          local_1848 = (pvVar8->second).
                       super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          local_1850 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &err->_M_string_length;
          local_1868 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &(local_1860->_name)._M_string_length;
          path = &((pvVar8->second).
                   super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>.
                   _M_impl.super__Vector_impl_data._M_start)->prim_path;
          goto LAB_00170380;
        case Add:
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"CompositeReferencesRec");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x2c3);
          ::std::operator<<(poVar6," ");
          pcVar12 = "`add` references are not supported yet.";
          break;
        case Delete:
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"CompositeReferencesRec");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x2c1);
          ::std::operator<<(poVar6," ");
          pcVar12 = "`delete` references are not supported yet.";
          break;
        case Order:
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"CompositeReferencesRec");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x2c5);
          ::std::operator<<(poVar6," ");
          pcVar12 = "`order` references are not supported yet.";
          break;
        case Invalid:
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"CompositeReferencesRec");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x2c7);
          ::std::operator<<(poVar6," ");
          pcVar12 = "Invalid listedit qualifier to for `references`.";
        }
        poVar6 = ::std::operator<<((ostream *)&ss_e,pcVar12);
        ::std::operator<<(poVar6,"\n");
        if (warn != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::append((string *)warn);
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        goto LAB_00170b00;
      }
      err_00 = primspec;
      bVar5 = CompositeReferencesRec
                        (depth + 1,resolver,asset_search_paths,pLVar10,primspec,warn,err,
                         in_stack_ffffffffffffe770);
      pLVar10 = (Layer *)((long)&(pLVar10->_metas).timeCodesPerSecond._metas.customData.contained +
                         0x18);
    } while (bVar5);
  }
  return false;
LAB_00170380:
  paVar1 = &path[-1]._variant_part_str.field_2;
  if ((pointer)paVar1 == local_1848) goto switchD_0017014d_default;
  Layer::Layer((Layer *)&ss_e);
  src_ps = (PrimSpec *)0x0;
  if (*(long *)((long)&path[-1]._variant_part_str.field_2 + 8) == 0) {
    if (((path->_prim_part)._M_string_length == 0) || (*(path->_prim_part)._M_dataplus._M_p != '/'))
    {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
      poVar6 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"CompositeReferencesRec");
      poVar6 = ::std::operator<<(poVar6,"():");
      iVar11 = 0x2d9;
      goto LAB_001708bd;
    }
    args = warn;
    bVar5 = Layer::find_primspec_at((Layer *)asset_search_paths,path,&src_ps,warn);
    pPVar9 = extraout_RDX_02;
    if (!bVar5) goto LAB_00170af3;
  }
  else {
    args = (string *)local_1850;
    err_00 = (PrimSpec *)paVar1;
    bVar5 = LoadAsset(resolver,&cwp,&search_paths,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                       *)local_1850,(AssetPath *)paVar1,path,(Layer *)&ss_e,&src_ps,true,
                      *(bool *)((long)&(err->_M_dataplus)._M_p + 4),
                      *(bool *)((long)&(err->_M_dataplus)._M_p + 5),(string *)primspec,warn);
    pPVar9 = extraout_RDX_01;
    if (!bVar5) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
      poVar6 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"CompositeReferencesRec");
      poVar6 = ::std::operator<<(poVar6,"():");
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x2e3);
      ::std::operator<<(poVar6," ");
      ::std::__cxx11::string::string
                ((string *)&local_17f8,"Failed to `references` asset `{}`",(allocator *)&local_1818)
      ;
      fmt::format<std::__cxx11::string>
                (&local_1838,(fmt *)&local_17f8,(string *)paVar1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      goto LAB_00170a8a;
    }
  }
  pLVar10 = local_1860;
  if (src_ps != (PrimSpec *)0x0) {
    args = warn;
    local_1858 = (AssetPath *)paVar1;
    bVar5 = OverridePrimSpec((tinyusdz *)local_1860,src_ps,pPVar9,warn,(string *)err_00);
    if (!bVar5) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
      poVar6 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"CompositeReferencesRec");
      poVar6 = ::std::operator<<(poVar6,"():");
      iVar11 = 0x2ef;
      goto LAB_00170a45;
    }
    if (((((pLVar10->_name).field_2._M_allocated_capacity == 0) ||
         (bVar5 = ::std::operator==(local_1868,"Model"), bVar5)) &&
        ((src_ps->_typeName)._M_string_length != 0)) &&
       (bVar5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&src_ps->_typeName,"Model"), !bVar5)) {
      ::std::__cxx11::string::_M_assign((string *)local_1868);
    }
  }
  Layer::~Layer((Layer *)&ss_e);
  path = (Path *)&path[1]._variant_part_str;
  goto LAB_00170380;
LAB_0017017f:
  paVar1 = &path[-1]._variant_part_str.field_2;
  if ((pointer)paVar1 == local_1848) {
switchD_0017014d_default:
    nonstd::optional_lite::
    optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>_>
    ::reset(local_1840);
    bVar5 = true;
LAB_00170b02:
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&search_paths);
    ::std::__cxx11::string::_M_dispose();
    return bVar5;
  }
  Layer::Layer((Layer *)&ss_e);
  src_ps = (PrimSpec *)0x0;
  if (*(long *)((long)&path[-1]._variant_part_str.field_2 + 8) == 0) {
    if (((path->_prim_part)._M_string_length != 0) && (*(path->_prim_part)._M_dataplus._M_p == '/'))
    {
      args = warn;
      bVar5 = Layer::find_primspec_at((Layer *)asset_search_paths,path,&src_ps,warn);
      pPVar9 = extraout_RDX_00;
      if (bVar5) goto LAB_0017023c;
      goto LAB_00170af3;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
    poVar6 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
    poVar6 = ::std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                              );
    poVar6 = ::std::operator<<(poVar6,":");
    poVar6 = ::std::operator<<(poVar6,"CompositeReferencesRec");
    poVar6 = ::std::operator<<(poVar6,"():");
    iVar11 = 0x297;
LAB_001708bd:
    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,iVar11);
    ::std::operator<<(poVar6," ");
    ::std::__cxx11::string::string
              ((string *)&local_17f8,
               "Invalid asset path. assetPath is empty and primPath is not absolute path: {}",
               &local_1871);
    Path::full_path_name_abi_cxx11_(&local_1818,path);
    fmt::format<std::__cxx11::string>
              (&local_1838,(fmt *)&local_17f8,(string *)&local_1818,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    poVar6 = ::std::operator<<((ostream *)&ss_e_1,(string *)&local_1838);
    ::std::operator<<(poVar6,"\n");
    ::std::__cxx11::string::_M_dispose();
LAB_00170aa4:
    ::std::__cxx11::string::_M_dispose();
LAB_00170aaf:
    ::std::__cxx11::string::_M_dispose();
    if (warn != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)warn);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_1);
LAB_00170af3:
    Layer::~Layer((Layer *)&ss_e);
LAB_00170b00:
    bVar5 = false;
    goto LAB_00170b02;
  }
  args = (string *)local_1850;
  err_00 = (PrimSpec *)paVar1;
  bVar5 = LoadAsset(resolver,&cwp,&search_paths,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                     *)local_1850,(AssetPath *)paVar1,path,(Layer *)&ss_e,&src_ps,true,
                    *(bool *)((long)&(err->_M_dataplus)._M_p + 4),
                    *(bool *)((long)&(err->_M_dataplus)._M_p + 5),(string *)primspec,warn);
  pPVar9 = extraout_RDX;
  if (!bVar5) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
    poVar6 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
    poVar6 = ::std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                              );
    poVar6 = ::std::operator<<(poVar6,":");
    poVar6 = ::std::operator<<(poVar6,"CompositeReferencesRec");
    poVar6 = ::std::operator<<(poVar6,"():");
    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x2a5);
    ::std::operator<<(poVar6," ");
    ::std::__cxx11::string::string
              ((string *)&local_17f8,"Failed to `references` asset `{}`",(allocator *)&local_1818);
    fmt::format<std::__cxx11::string>
              (&local_1838,(fmt *)&local_17f8,(string *)paVar1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    poVar6 = ::std::operator<<((ostream *)&ss_e_1,(string *)&local_1838);
    ::std::operator<<(poVar6,"\n");
    ::std::__cxx11::string::_M_dispose();
    goto LAB_00170aaf;
  }
LAB_0017023c:
  pLVar10 = local_1860;
  if (src_ps != (PrimSpec *)0x0) {
    args = warn;
    local_1858 = (AssetPath *)paVar1;
    bVar5 = InheritPrimSpec((tinyusdz *)local_1860,src_ps,pPVar9,warn,(string *)err_00);
    if (!bVar5) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
      poVar6 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"CompositeReferencesRec");
      poVar6 = ::std::operator<<(poVar6,"():");
      iVar11 = 0x2b1;
LAB_00170a45:
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,iVar11);
      ::std::operator<<(poVar6," ");
      ::std::__cxx11::string::string
                ((string *)&local_17f8,"Failed to reference layer `{}`",(allocator *)&local_1818);
      fmt::format<tinyusdz::value::AssetPath>((string *)&local_1838,&local_17f8,local_1858);
LAB_00170a8a:
      poVar6 = ::std::operator<<((ostream *)&ss_e_1,(string *)&local_1838);
      ::std::operator<<(poVar6,"\n");
      goto LAB_00170aa4;
    }
    if ((((pLVar10->_name).field_2._M_allocated_capacity == 0) ||
        (bVar5 = ::std::operator==(local_1868,"Model"), bVar5)) &&
       (((src_ps->_typeName)._M_string_length != 0 &&
        (bVar5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&src_ps->_typeName,"Model"), !bVar5)))) {
      ::std::__cxx11::string::_M_assign((string *)local_1868);
    }
  }
  Layer::~Layer((Layer *)&ss_e);
  path = (Path *)&path[1]._variant_part_str;
  goto LAB_0017017f;
}

Assistant:

bool CompositeReferencesRec(uint32_t depth, AssetResolutionResolver &resolver,
                            const std::vector<std::string> &asset_search_paths,
                            const Layer &in_layer,
                            PrimSpec &primspec /* [inout] */, std::string *warn,
                            std::string *err,
                            const ReferencesCompositionOptions &options) {
  if (depth > options.max_depth) {
    PUSH_ERROR_AND_RETURN("Too deep.");
  }

  // Traverse children first.
  for (auto &child : primspec.children()) {
    if (!CompositeReferencesRec(depth + 1, resolver, asset_search_paths, in_layer, child,
                                warn, err, options)) {
      return false;
    }
  }

  // Use PrimSpec's AssetResolution state.
  std::string cwp = primspec.get_current_working_path();
  std::vector<std::string> search_paths = primspec.get_asset_search_paths();

  if (primspec.metas().references) {
    const ListEditQual &qual = primspec.metas().references.value().first;
    const auto &refecences = primspec.metas().references.value().second;

    if ((qual == ListEditQual::ResetToExplicit) ||
        (qual == ListEditQual::Prepend)) {
      for (const auto &reference : refecences) {
        Layer layer;
        const PrimSpec *src_ps{nullptr};

        if (reference.asset_path.GetAssetPath().empty()) {
          if (reference.prim_path.is_absolute_path()) {
            // Inherit-like operation.

            if (!in_layer.find_primspec_at(reference.prim_path, &src_ps, err)) {
              return false;
            }

          } else {
            PUSH_ERROR_AND_RETURN(
                fmt::format("Invalid asset path. assetPath is empty and "
                            "primPath is not absolute path: {}",
                            reference.prim_path.full_path_name()));
          }
        } else {

          DCOUT("reference.prim_path = " << reference.prim_path);
          DCOUT("primspec.cwp = " << cwp);
          DCOUT("primspec.search_paths = " << search_paths);
          if (!LoadAsset(resolver, cwp, search_paths, options.fileformats,
                         reference.asset_path, reference.prim_path, &layer,
                         &src_ps, /* error_when_no_prims_found */ true,
                         options.error_when_asset_not_found,
                         options.error_when_unsupported_fileformat, warn, err)) {
            PUSH_ERROR_AND_RETURN(
                fmt::format("Failed to `references` asset `{}`",
                            reference.asset_path.GetAssetPath()));
          }
        }

        if (!src_ps) {
          // LoadAsset allowed not-found or unsupported file. so do nothing.
          continue;
        }

        // `inherits` op
        if (!InheritPrimSpec(primspec, *src_ps, warn, err)) {
          PUSH_ERROR_AND_RETURN(fmt::format("Failed to reference layer `{}`",
                                            reference.asset_path));
        }

        // Modify Prim type if this PrimSpec is Model type.
        if (primspec.typeName().empty() || primspec.typeName() == "Model") {
          if (src_ps->typeName().empty() || src_ps->typeName() == "Model") {
            // pass
          } else {
            primspec.typeName() = src_ps->typeName();
          }
        }

        DCOUT("inherit done: primspec = " << primspec.name());
      }

    } else if (qual == ListEditQual::Delete) {
      PUSH_ERROR_AND_RETURN("`delete` references are not supported yet.");
    } else if (qual == ListEditQual::Add) {
      PUSH_ERROR_AND_RETURN("`add` references are not supported yet.");
    } else if (qual == ListEditQual::Order) {
      PUSH_ERROR_AND_RETURN("`order` references are not supported yet.");
    } else if (qual == ListEditQual::Invalid) {
      PUSH_ERROR_AND_RETURN("Invalid listedit qualifier to for `references`.");
    } else if (qual == ListEditQual::Append) {
      for (const auto &reference : refecences) {
        Layer layer;
        const PrimSpec *src_ps{nullptr};

        if (reference.asset_path.GetAssetPath().empty()) {
          if (reference.prim_path.is_absolute_path()) {
            // Inherit-like operation.

            if (!in_layer.find_primspec_at(reference.prim_path, &src_ps, err)) {
              return false;
            }

          } else {
            PUSH_ERROR_AND_RETURN(
                fmt::format("Invalid asset path. assetPath is empty and "
                            "primPath is not absolute path: {}",
                            reference.prim_path.full_path_name()));
          }
        } else {
          if (!LoadAsset(resolver, cwp, search_paths, options.fileformats,
                         reference.asset_path, reference.prim_path, &layer,
                         &src_ps, /* error_when_no_prims */ true,
                         options.error_when_asset_not_found,
                         options.error_when_unsupported_fileformat, warn, err)) {
            PUSH_ERROR_AND_RETURN(
                fmt::format("Failed to `references` asset `{}`",
                            reference.asset_path.GetAssetPath()));
          }
        }

        if (!src_ps) {
          // LoadAsset allowed not-found or unsupported file. so do nothing.
          continue;
        }

        // `over` op
        if (!OverridePrimSpec(primspec, *src_ps, warn, err)) {
          PUSH_ERROR_AND_RETURN(fmt::format("Failed to reference layer `{}`",
                                            reference.asset_path));
        }

        // Modify Prim type if this PrimSpec is Model type.
        if (primspec.typeName().empty() || primspec.typeName() == "Model") {
          if (src_ps->typeName().empty() || src_ps->typeName() == "Model") {
            // pass
          } else {
            primspec.typeName() = src_ps->typeName();
          }
        }
      }
    }

  }

  // Remove `references`.
  primspec.metas().references.reset();

  return true;
}